

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O0

void handle_server_error(cio_http_client *client,char *msg)

{
  cio_error cVar1;
  cio_http_server *server_00;
  cio_error err;
  cio_http_server *server;
  char *msg_local;
  cio_http_client *client_local;
  
  server_00 = cio_http_client_get_server(client);
  handle_error(server_00,msg);
  cVar1 = write_response(client,CIO_HTTP_STATUS_INTERNAL_SERVER_ERROR,(cio_write_buffer *)0x0,
                         (cio_response_written_cb_t)0x0);
  if (cVar1 != CIO_SUCCESS) {
    mark_to_be_closed(client);
  }
  return;
}

Assistant:

static void handle_server_error(struct cio_http_client *client, const char *msg)
{
	struct cio_http_server *server = cio_http_client_get_server(client);
	handle_error(server, msg);
	enum cio_error err = write_response(client, CIO_HTTP_STATUS_INTERNAL_SERVER_ERROR, NULL, NULL);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		mark_to_be_closed(client);
	}
}